

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_etc.h
# Opt level: O2

bool __thiscall
basisu::etc_block::get_block_colors
          (etc_block *this,color_rgba *pBlock_colors,uint32_t subblock_index)

{
  int iVar1;
  int iVar2;
  uint16_t uVar3;
  uint16_t packed_delta3;
  uint32_t uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint sb;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  color_rgba b;
  
  if (((this->field_0).m_bytes[3] & 2) == 0) {
    uVar3 = get_base4_color(this,subblock_index);
    b = unpack_color4(uVar3,true,0xff);
  }
  else {
    uVar3 = get_base5_color(this);
    if (subblock_index == 0) {
      unpack_color5(&b,uVar3,true);
    }
    else {
      packed_delta3 = get_delta3_color(this);
      unpack_color5(&b,uVar3,packed_delta3,true,0xff);
    }
  }
  uVar4 = get_inten_table(this,subblock_index);
  uVar13 = (ulong)uVar4;
  iVar1 = (&g_etc1_inten_tables)[uVar13 * 4];
  uVar12 = ((uint)b.field_0 & 0xff) + iVar1;
  uVar9 = 0xff;
  if (uVar12 < 0xff) {
    uVar9 = uVar12;
  }
  if ((int)uVar12 < 0) {
    uVar9 = 0;
  }
  iVar2 = (&DAT_003099e4)[uVar13 * 4];
  uVar14 = ((uint)b.field_0 >> 8 & 0xff) + iVar1;
  uVar8 = 0xff;
  if (uVar14 < 0xff) {
    uVar8 = uVar14;
  }
  if ((int)uVar14 < 0) {
    uVar8 = 0;
  }
  uVar10 = ((uint)b.field_0 >> 0x10 & 0xff) + iVar1;
  uVar7 = 0xff;
  if (uVar10 < 0xff) {
    uVar7 = uVar10;
  }
  if ((int)uVar10 < 0) {
    uVar7 = 0;
  }
  color_rgba::set(pBlock_colors,uVar9,uVar8,uVar7,0xff);
  uVar8 = ((uint)b.field_0 & 0xff) + iVar2;
  uVar9 = 0xff;
  if (uVar8 < 0xff) {
    uVar9 = uVar8;
  }
  if ((int)uVar8 < 0) {
    uVar9 = 0;
  }
  uVar5 = ((uint)b.field_0 >> 8 & 0xff) + iVar2;
  uVar7 = 0xff;
  if (uVar5 < 0xff) {
    uVar7 = uVar5;
  }
  if ((int)uVar5 < 0) {
    uVar7 = 0;
  }
  uVar6 = ((uint)b.field_0 >> 0x10 & 0xff) + iVar2;
  uVar15 = 0xff;
  if (uVar6 < 0xff) {
    uVar15 = uVar6;
  }
  uVar8 = uVar8 | uVar5 | uVar14 | uVar10 | uVar6;
  if ((int)uVar6 < 0) {
    uVar15 = 0;
  }
  color_rgba::set(pBlock_colors + 1,uVar9,uVar7,uVar15,0xff);
  iVar1 = *(int *)(&DAT_003099e8 + uVar13 * 0x10);
  uVar14 = ((uint)b.field_0 & 0xff) + iVar1;
  uVar9 = 0xff;
  if (uVar14 < 0xff) {
    uVar9 = uVar14;
  }
  if ((int)uVar14 < 0) {
    uVar9 = 0;
  }
  uVar10 = ((uint)b.field_0 >> 8 & 0xff) + iVar1;
  uVar7 = 0xff;
  if (uVar10 < 0xff) {
    uVar7 = uVar10;
  }
  if ((int)uVar10 < 0) {
    uVar7 = 0;
  }
  uVar15 = ((uint)b.field_0 >> 0x10 & 0xff) + iVar1;
  uVar5 = 0xff;
  if (uVar15 < 0xff) {
    uVar5 = uVar15;
  }
  if ((int)uVar15 < 0) {
    uVar5 = 0;
  }
  color_rgba::set(pBlock_colors + 2,uVar9,uVar7,uVar5,0xff);
  iVar1 = *(int *)(&DAT_003099ec + uVar13 * 0x10);
  uVar7 = ((uint)b.field_0 & 0xff) + iVar1;
  uVar9 = 0xff;
  if (uVar7 < 0xff) {
    uVar9 = uVar7;
  }
  if ((int)uVar7 < 0) {
    uVar9 = 0;
  }
  uVar6 = ((uint)b.field_0 >> 8 & 0xff) + iVar1;
  uVar5 = 0xff;
  if (uVar6 < 0xff) {
    uVar5 = uVar6;
  }
  if ((int)uVar6 < 0) {
    uVar5 = 0;
  }
  uVar11 = ((uint)b.field_0 >> 0x10 & 0xff) + iVar1;
  sb = 0xff;
  if (uVar11 < 0xff) {
    sb = uVar11;
  }
  if ((int)uVar11 < 0) {
    sb = 0;
  }
  color_rgba::set(pBlock_colors + 3,uVar9,uVar5,sb,0xff);
  return ((int)(uVar7 | uVar15 | uVar14 | uVar11) < 0 ||
         0xff < (uVar6 | uVar10 | uVar7 | uVar15 | uVar11)) ||
         (0xff < (uVar12 | uVar14 | uVar8) || (int)uVar8 < 0);
}

Assistant:

bool get_block_colors(color_rgba* pBlock_colors, uint32_t subblock_index) const
		{
			color_rgba b;

			if (get_diff_bit())
			{
				if (subblock_index)
					unpack_color5(b, get_base5_color(), get_delta3_color(), true);
				else
					unpack_color5(b, get_base5_color(), true);
			}
			else
			{
				b = unpack_color4(get_base4_color(subblock_index), true);
			}

			const int* pInten_table = g_etc1_inten_tables[get_inten_table(subblock_index)];

			bool dc = false;

			pBlock_colors[0].set(clamp255(b.r + pInten_table[0], dc), clamp255(b.g + pInten_table[0], dc), clamp255(b.b + pInten_table[0], dc), 255);
			pBlock_colors[1].set(clamp255(b.r + pInten_table[1], dc), clamp255(b.g + pInten_table[1], dc), clamp255(b.b + pInten_table[1], dc), 255);
			pBlock_colors[2].set(clamp255(b.r + pInten_table[2], dc), clamp255(b.g + pInten_table[2], dc), clamp255(b.b + pInten_table[2], dc), 255);
			pBlock_colors[3].set(clamp255(b.r + pInten_table[3], dc), clamp255(b.g + pInten_table[3], dc), clamp255(b.b + pInten_table[3], dc), 255);

			return dc;
		}